

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

VoidCastedCallStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::VoidCastedCallStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,ExpressionSyntax *args_5,Token *args_6,Token *args_7)

{
  Token voidKeyword;
  Token semi;
  VoidCastedCallStatementSyntax *label;
  Token *in_RCX;
  Token *in_R8;
  Token *in_R9;
  undefined8 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  BumpAllocator *in_stack_ffffffffffffff48;
  
  label = (VoidCastedCallStatementSyntax *)
          allocate(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  voidKeyword.info = (Info *)*in_stack_00000010;
  voidKeyword._0_8_ = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000018[1];
  semi.info = (Info *)in_R8;
  semi._0_8_ = in_R9;
  slang::syntax::VoidCastedCallStatementSyntax::VoidCastedCallStatementSyntax
            ((VoidCastedCallStatementSyntax *)*in_stack_00000018,(NamedLabelSyntax *)label,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000018[1],voidKeyword,
             *in_R9,*in_R8,(ExpressionSyntax *)*in_stack_00000018,*in_RCX,semi);
  return label;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }